

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft4g.c
# Opt level: O1

void cftmdl(size_t n,size_t l,float *a,float *w)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  long local_78;
  
  uVar3 = l * 4;
  if (l != 0) {
    uVar5 = 0;
    do {
      lVar7 = uVar5 + l;
      lVar6 = lVar7 + l;
      fVar12 = a[uVar5] + a[lVar7];
      fVar13 = a[uVar5 + 1] + a[lVar7 + 1];
      fVar9 = a[uVar5] - a[lVar7];
      fVar8 = a[uVar5 + 1] - a[lVar7 + 1];
      fVar14 = a[lVar6] + a[l + lVar6];
      fVar15 = a[lVar6 + 1] + a[l + lVar6 + 1];
      fVar10 = a[lVar6] - a[l + lVar6];
      fVar11 = a[lVar6 + 1] - a[l + lVar6 + 1];
      a[uVar5] = fVar12 + fVar14;
      a[uVar5 + 1] = fVar13 + fVar15;
      a[lVar6] = fVar12 - fVar14;
      a[lVar6 + 1] = fVar13 - fVar15;
      a[lVar7] = fVar9 - fVar11;
      a[lVar7 + 1] = fVar8 + fVar10;
      a[l + lVar6] = fVar11 + fVar9;
      a[l + lVar6 + 1] = fVar8 - fVar10;
      uVar5 = uVar5 + 2;
    } while (uVar5 < l);
  }
  if (uVar3 < l * 5) {
    fVar8 = w[2];
    lVar7 = 0;
    do {
      fVar13 = a[l * 4 + lVar7] + a[l * 5 + lVar7];
      fVar14 = a[l * 4 + lVar7 + 1] + a[l * 5 + lVar7 + 1];
      fVar10 = a[l * 4 + lVar7] - a[l * 5 + lVar7];
      fVar9 = a[l * 4 + lVar7 + 1] - a[l * 5 + lVar7 + 1];
      fVar15 = a[l * 6 + lVar7] + a[l * 7 + lVar7];
      fVar16 = a[l * 6 + lVar7 + 1] + a[l * 7 + lVar7 + 1];
      fVar11 = a[l * 6 + lVar7] - a[l * 7 + lVar7];
      fVar12 = a[l * 6 + lVar7 + 1] - a[l * 7 + lVar7 + 1];
      a[l * 4 + lVar7] = fVar13 + fVar15;
      a[l * 4 + lVar7 + 1] = fVar14 + fVar16;
      a[l * 6 + lVar7] = fVar16 - fVar14;
      a[l * 6 + lVar7 + 1] = fVar13 - fVar15;
      fVar13 = fVar10 - fVar12;
      fVar14 = fVar9 + fVar11;
      a[l * 5 + lVar7] = (fVar13 - fVar14) * fVar8;
      a[l * 5 + lVar7 + 1] = (fVar14 + fVar13) * fVar8;
      fVar12 = fVar12 + fVar10;
      fVar11 = fVar11 - fVar9;
      a[l * 7 + lVar7] = (fVar11 - fVar12) * fVar8;
      a[l * 7 + lVar7 + 1] = (fVar11 + fVar12) * fVar8;
      lVar6 = uVar3 + lVar7;
      lVar7 = lVar7 + 2;
    } while (lVar6 + 2U < l * 5);
  }
  uVar5 = l * 8;
  if (uVar5 < n) {
    local_78 = 0;
    lVar7 = 0;
    uVar4 = uVar5;
    do {
      fVar8 = w[lVar7 + 2];
      fVar9 = w[lVar7 + 3];
      if (uVar4 < uVar4 + l) {
        fVar10 = w[lVar7 * 2 + 4];
        fVar11 = w[lVar7 * 2 + 5];
        fVar13 = fVar10 - (fVar9 + fVar9) * fVar11;
        fVar12 = (fVar9 + fVar9) * fVar10 - fVar11;
        lVar6 = local_78;
        do {
          fVar20 = a[l * 8 + lVar6] + a[l * 9 + lVar6];
          fVar21 = a[l * 8 + lVar6 + 1] + a[l * 9 + lVar6 + 1];
          fVar19 = a[l * 8 + lVar6] - a[l * 9 + lVar6];
          fVar17 = a[l * 8 + lVar6 + 1] - a[l * 9 + lVar6 + 1];
          fVar15 = a[l * 10 + lVar6] + a[l * 0xb + lVar6];
          fVar16 = a[l * 10 + lVar6] - a[l * 0xb + lVar6];
          fVar14 = a[l * 10 + lVar6 + 1] + a[l * 0xb + lVar6 + 1];
          fVar18 = a[l * 10 + lVar6 + 1] - a[l * 0xb + lVar6 + 1];
          a[l * 8 + lVar6] = fVar20 + fVar15;
          a[l * 8 + lVar6 + 1] = fVar21 + fVar14;
          fVar20 = fVar20 - fVar15;
          fVar21 = fVar21 - fVar14;
          a[l * 10 + lVar6] = fVar8 * fVar20 + fVar21 * -fVar9;
          a[l * 10 + lVar6 + 1] = fVar20 * fVar9 + fVar8 * fVar21;
          fVar14 = fVar19 - fVar18;
          fVar15 = fVar17 + fVar16;
          a[l * 9 + lVar6] = fVar10 * fVar14 + fVar15 * -fVar11;
          a[l * 9 + lVar6 + 1] = fVar14 * fVar11 + fVar10 * fVar15;
          fVar18 = fVar18 + fVar19;
          fVar17 = fVar17 - fVar16;
          a[l * 0xb + lVar6] = fVar13 * fVar18 + fVar17 * -fVar12;
          a[l * 0xb + lVar6 + 1] = fVar18 * fVar12 + fVar13 * fVar17;
          lVar1 = uVar5 + lVar6;
          lVar6 = lVar6 + 2;
        } while (lVar1 + 2U < uVar4 + l);
      }
      uVar2 = uVar3 + uVar4 + l;
      if (uVar3 + uVar4 < uVar2) {
        fVar10 = w[lVar7 * 2 + 6];
        fVar11 = w[lVar7 * 2 + 7];
        fVar13 = fVar10 - (fVar8 + fVar8) * fVar11;
        fVar12 = (fVar8 + fVar8) * fVar10 - fVar11;
        lVar6 = local_78;
        do {
          fVar20 = a[l * 0xc + lVar6] + a[l * 0xd + lVar6];
          fVar21 = a[l * 0xc + lVar6 + 1] + a[l * 0xd + lVar6 + 1];
          fVar19 = a[l * 0xc + lVar6] - a[l * 0xd + lVar6];
          fVar17 = a[l * 0xc + lVar6 + 1] - a[l * 0xd + lVar6 + 1];
          fVar15 = a[l * 0xe + lVar6] + a[l * 0xf + lVar6];
          fVar16 = a[l * 0xe + lVar6] - a[l * 0xf + lVar6];
          fVar14 = a[l * 0xe + lVar6 + 1] + a[l * 0xf + lVar6 + 1];
          fVar18 = a[l * 0xe + lVar6 + 1] - a[l * 0xf + lVar6 + 1];
          a[l * 0xc + lVar6] = fVar20 + fVar15;
          a[l * 0xc + lVar6 + 1] = fVar21 + fVar14;
          fVar20 = fVar20 - fVar15;
          fVar21 = fVar21 - fVar14;
          a[l * 0xe + lVar6] = -fVar9 * fVar20 + fVar21 * -fVar8;
          a[l * 0xe + lVar6 + 1] = fVar20 * fVar8 + -fVar9 * fVar21;
          fVar14 = fVar19 - fVar18;
          fVar15 = fVar17 + fVar16;
          a[l * 0xd + lVar6] = fVar10 * fVar14 + fVar15 * -fVar11;
          a[l * 0xd + lVar6 + 1] = fVar14 * fVar11 + fVar10 * fVar15;
          fVar18 = fVar18 + fVar19;
          fVar17 = fVar17 - fVar16;
          a[l * 0xf + lVar6] = fVar13 * fVar18 + fVar17 * -fVar12;
          a[l * 0xf + lVar6 + 1] = fVar18 * fVar12 + fVar13 * fVar17;
          lVar1 = l * 0xc + lVar6;
          lVar6 = lVar6 + 2;
        } while (lVar1 + 2U < uVar2);
      }
      lVar7 = lVar7 + 2;
      uVar4 = uVar4 + uVar5;
      local_78 = local_78 + uVar5;
    } while (uVar4 < n);
  }
  return;
}

Assistant:

static void cftmdl(size_t n, size_t l, float *a, float *w)
{
    size_t j, j1, j2, j3, k, k1, k2, m, m2;
    float wk1r, wk1i, wk2r, wk2i, wk3r, wk3i;
    float x0r, x0i, x1r, x1i, x2r, x2i, x3r, x3i;

    m = l << 2;
    for (j = 0; j < l; j += 2) {
        j1 = j + l;
        j2 = j1 + l;
        j3 = j2 + l;
        x0r = a[j] + a[j1];
        x0i = a[j + 1] + a[j1 + 1];
        x1r = a[j] - a[j1];
        x1i = a[j + 1] - a[j1 + 1];
        x2r = a[j2] + a[j3];
        x2i = a[j2 + 1] + a[j3 + 1];
        x3r = a[j2] - a[j3];
        x3i = a[j2 + 1] - a[j3 + 1];
        a[j] = x0r + x2r;
        a[j + 1] = x0i + x2i;
        a[j2] = x0r - x2r;
        a[j2 + 1] = x0i - x2i;
        a[j1] = x1r - x3i;
        a[j1 + 1] = x1i + x3r;
        a[j3] = x1r + x3i;
        a[j3 + 1] = x1i - x3r;
    }
    wk1r = w[2];
    for (j = m; j < l + m; j += 2) {
        j1 = j + l;
        j2 = j1 + l;
        j3 = j2 + l;
        x0r = a[j] + a[j1];
        x0i = a[j + 1] + a[j1 + 1];
        x1r = a[j] - a[j1];
        x1i = a[j + 1] - a[j1 + 1];
        x2r = a[j2] + a[j3];
        x2i = a[j2 + 1] + a[j3 + 1];
        x3r = a[j2] - a[j3];
        x3i = a[j2 + 1] - a[j3 + 1];
        a[j] = x0r + x2r;
        a[j + 1] = x0i + x2i;
        a[j2] = x2i - x0i;
        a[j2 + 1] = x0r - x2r;
        x0r = x1r - x3i;
        x0i = x1i + x3r;
        a[j1] = wk1r * (x0r - x0i);
        a[j1 + 1] = wk1r * (x0r + x0i);
        x0r = x3i + x1r;
        x0i = x3r - x1i;
        a[j3] = wk1r * (x0i - x0r);
        a[j3 + 1] = wk1r * (x0i + x0r);
    }
    k1 = 0;
    m2 = 2 * m;
    for (k = m2; k < n; k += m2) {
        k1 += 2;
        k2 = 2 * k1;
        wk2r = w[k1];
        wk2i = w[k1 + 1];
        wk1r = w[k2];
        wk1i = w[k2 + 1];
        wk3r = wk1r - 2 * wk2i * wk1i;
        wk3i = 2 * wk2i * wk1r - wk1i;
        for (j = k; j < l + k; j += 2) {
            j1 = j + l;
            j2 = j1 + l;
            j3 = j2 + l;
            x0r = a[j] + a[j1];
            x0i = a[j + 1] + a[j1 + 1];
            x1r = a[j] - a[j1];
            x1i = a[j + 1] - a[j1 + 1];
            x2r = a[j2] + a[j3];
            x2i = a[j2 + 1] + a[j3 + 1];
            x3r = a[j2] - a[j3];
            x3i = a[j2 + 1] - a[j3 + 1];
            a[j] = x0r + x2r;
            a[j + 1] = x0i + x2i;
            x0r -= x2r;
            x0i -= x2i;
            a[j2] = wk2r * x0r - wk2i * x0i;
            a[j2 + 1] = wk2r * x0i + wk2i * x0r;
            x0r = x1r - x3i;
            x0i = x1i + x3r;
            a[j1] = wk1r * x0r - wk1i * x0i;
            a[j1 + 1] = wk1r * x0i + wk1i * x0r;
            x0r = x1r + x3i;
            x0i = x1i - x3r;
            a[j3] = wk3r * x0r - wk3i * x0i;
            a[j3 + 1] = wk3r * x0i + wk3i * x0r;
        }
        wk1r = w[k2 + 2];
        wk1i = w[k2 + 3];
        wk3r = wk1r - 2 * wk2r * wk1i;
        wk3i = 2 * wk2r * wk1r - wk1i;
        for (j = k + m; j < l + (k + m); j += 2) {
            j1 = j + l;
            j2 = j1 + l;
            j3 = j2 + l;
            x0r = a[j] + a[j1];
            x0i = a[j + 1] + a[j1 + 1];
            x1r = a[j] - a[j1];
            x1i = a[j + 1] - a[j1 + 1];
            x2r = a[j2] + a[j3];
            x2i = a[j2 + 1] + a[j3 + 1];
            x3r = a[j2] - a[j3];
            x3i = a[j2 + 1] - a[j3 + 1];
            a[j] = x0r + x2r;
            a[j + 1] = x0i + x2i;
            x0r -= x2r;
            x0i -= x2i;
            a[j2] = -wk2i * x0r - wk2r * x0i;
            a[j2 + 1] = -wk2i * x0i + wk2r * x0r;
            x0r = x1r - x3i;
            x0i = x1i + x3r;
            a[j1] = wk1r * x0r - wk1i * x0i;
            a[j1 + 1] = wk1r * x0i + wk1i * x0r;
            x0r = x1r + x3i;
            x0i = x1i - x3r;
            a[j3] = wk3r * x0r - wk3i * x0i;
            a[j3 + 1] = wk3r * x0i + wk3i * x0r;
        }
    }
}